

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManCheckTopoOrder_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  
  uVar4 = 1;
  uVar1 = uVar4;
  if (pObj->Value != 0) {
    pObj->Value = 0;
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                    ,0xd7,"int Gia_ManCheckTopoOrder_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = Gia_ManCheckTopoOrder_rec(p,pObj + -(ulong)uVar1);
    uVar1 = 0;
    if (((iVar2 != 0) &&
        (iVar2 = Gia_ManCheckTopoOrder_rec
                           (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff)), iVar2 != 0))
       && (uVar1 = uVar4, p->pReprs != (Gia_Rpr_t *)0x0)) {
      iVar2 = Gia_ObjId(p,pObj);
      pGVar3 = Gia_ObjReprObj(p,iVar2);
      if (pGVar3 != (Gia_Obj_t *)0x0) {
        uVar1 = (uint)(pGVar3->Value == 0);
      }
    }
  }
  return uVar1;
}

Assistant:

int Gia_ManCheckTopoOrder_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( pObj->Value == 0 )
        return 1;
    pObj->Value = 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( !Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin0(pObj) ) )
        return 0;
    if ( !Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin1(pObj) ) )
        return 0;
    pRepr = p->pReprs ? Gia_ObjReprObj( p, Gia_ObjId(p,pObj) ) : NULL;
    return pRepr == NULL || pRepr->Value == 0;
}